

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void apu_synchronize(Emulator *e)

{
  Channel *channel;
  u32 *puVar1;
  Ticks *pTVar2;
  u8 *puVar3;
  int *piVar4;
  byte bVar5;
  u8 uVar6;
  ushort uVar7;
  ulong uVar8;
  ushort uVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  u16 uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  short sVar17;
  uint uVar18;
  ulong uVar19;
  Channel *pCVar20;
  uint uVar21;
  ushort uVar22;
  uint uVar23;
  u32 total_frames;
  u32 uVar24;
  Channel *in_RSI;
  u32 uVar25;
  byte bVar26;
  byte bVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  bool bVar31;
  int local_40;
  
  uVar19 = (e->state).ticks;
  uVar8 = (e->state).apu.sync_ticks;
  if (uVar8 < uVar19) {
    iVar29 = (int)uVar19;
    iVar30 = (int)uVar8;
    if ((e->state).apu.enabled == FALSE) {
      for (iVar30 = iVar30 - iVar29; iVar30 != 0; iVar30 = iVar30 + 2) {
        write_audio_frame(e,1);
      }
      (e->state).apu.sync_ticks = (e->state).ticks;
    }
    else {
      uVar14 = iVar29 - iVar30;
      channel = (e->state).apu.channel;
      while( true ) {
        uVar19 = (e->state).apu.sync_ticks;
        if (uVar14 == 0) break;
        if ((uVar19 & 0x1fff) == 0) {
          bVar12 = (e->state).apu.frame + 1 & 7;
          (e->state).apu.frame = bVar12;
          switch(bVar12) {
          case 2:
          case 6:
            if (((e->state).apu.channel[0].status != FALSE) &&
               ((e->state).apu.sweep.enabled != FALSE)) {
              uVar6 = (e->state).apu.sweep.period;
              puVar3 = &(e->state).apu.sweep.timer;
              *puVar3 = *puVar3 + 0xff;
              if (*puVar3 == '\0') {
                if (uVar6 == '\0') {
                  (e->state).apu.sweep.timer = '\b';
                }
                else {
                  (e->state).apu.sweep.timer = uVar6;
                  uVar13 = calculate_sweep_frequency(e);
                  if (uVar13 < 0x800) {
                    if ((e->state).apu.sweep.shift != '\0') {
                      HOOK_sweep_update_frequency_i(e,(char *)in_RSI,(ulong)uVar13);
                      (e->state).apu.channel[0].frequency = uVar13;
                      (e->state).apu.sweep.frequency = uVar13;
                      in_RSI = channel;
                      write_square_wave_period(e,channel,&channel->square_wave);
                    }
                    uVar13 = calculate_sweep_frequency(e);
                    if (0x7ff < uVar13) {
                      HOOK_sweep_overflow_2nd_v(e,(char *)in_RSI);
                      (e->state).apu.channel[0].status = FALSE;
                    }
                  }
                  else {
                    HOOK_sweep_overflow_v(e,(char *)in_RSI);
                    (e->state).apu.channel[0].status = FALSE;
                  }
                }
              }
            }
          case 0:
          case 4:
            for (lVar16 = 0; lVar16 != 0x100; lVar16 = lVar16 + 0x40) {
              if (((*(int *)((long)&(e->state).apu.channel[0].length_enabled + lVar16) != 0) &&
                  (sVar17 = *(short *)((long)&(e->state).apu.channel[0].length + lVar16),
                  sVar17 != 0)) &&
                 (sVar17 = sVar17 + -1,
                 *(short *)((long)&(e->state).apu.channel[0].length + lVar16) = sVar17, sVar17 == 0)
                 ) {
                *(undefined4 *)((long)&(e->state).apu.channel[0].status + lVar16) = 0;
              }
            }
            break;
          case 7:
            for (lVar16 = 0; lVar16 != 0x100; lVar16 = lVar16 + 0x40) {
              bVar12 = (&(e->state).apu.channel[0].envelope.period)[lVar16];
              if (bVar12 == 0) {
                *(undefined4 *)((long)&(e->state).apu.channel[0].envelope.timer + lVar16) = 8;
              }
              else if (*(int *)((long)&(e->state).apu.channel[0].envelope.automatic + lVar16) != 0)
              {
                piVar4 = (int *)((long)&(e->state).apu.channel[0].envelope.timer + lVar16);
                *piVar4 = *piVar4 + -1;
                if (*piVar4 == 0) {
                  *(uint *)((long)&(e->state).apu.channel[0].envelope.timer + lVar16) = (uint)bVar12
                  ;
                  bVar12 = (-(*(int *)((long)&(e->state).apu.channel[0].envelope.direction + lVar16)
                             == 0) | 1U) + (&(e->state).apu.channel[0].envelope.volume)[lVar16];
                  if (bVar12 < 0xf) {
                    (&(e->state).apu.channel[0].envelope.volume)[lVar16] = bVar12;
                  }
                  else {
                    *(undefined4 *)((long)&(e->state).apu.channel[0].envelope.automatic + lVar16) =
                         0;
                  }
                }
              }
            }
          }
        }
        uVar19 = 0x2000 - (ulong)((uint)uVar19 & 0x1fff);
        if (uVar14 <= uVar19) {
          uVar19 = (ulong)uVar14;
        }
        pCVar20 = (Channel *)(uVar19 >> 1 & 0x7fffffff);
        while (uVar18 = (uint)pCVar20, uVar18 != 0) {
          iVar29 = 0;
          for (uVar15 = (e->audio_buffer).freq_counter; uVar15 < 0x200000;
              uVar15 = uVar15 + (e->audio_buffer).frequency) {
            iVar29 = iVar29 + -1;
          }
          in_RSI = (Channel *)(ulong)(uint)-iVar29;
          if (uVar18 <= (uint)-iVar29) {
            in_RSI = pCVar20;
          }
          total_frames = (u32)in_RSI;
          update_square_wave(channel,total_frames);
          update_square_wave((e->state).apu.channel + 1,total_frames);
          if ((iVar29 != 0) && ((e->state).apu.channel[2].status != FALSE)) {
            iVar30 = (int)(e->state).apu.sync_ticks;
            pCVar20 = in_RSI;
            do {
              uVar15 = (e->state).apu.wave.ticks;
              uVar21 = uVar15 >> 1;
              bVar12 = (e->state).apu.wave.sample_data;
              bVar5 = (e->state).apu.wave.volume_shift;
              uVar28 = (uint)pCVar20;
              if (uVar28 < uVar21) {
                uVar23 = uVar28 * 2;
                (e->state).apu.wave.ticks = uVar15 + uVar28 * -2;
                uVar21 = uVar28;
              }
              else {
                bVar10 = (e->state).apu.wave.position + 1;
                bVar11 = bVar10 & 0x1f;
                (e->state).apu.wave.position = bVar11;
                (e->state).apu.wave.sample_time = (ulong)(iVar30 + uVar15);
                bVar26 = (e->state).apu.wave.ram[bVar11 >> 1];
                bVar27 = bVar26 & 0xf;
                if ((bVar10 & 1) == 0) {
                  bVar27 = bVar26 >> 4;
                }
                (e->state).apu.wave.sample_data = bVar27;
                (e->state).apu.wave.ticks = (e->state).apu.wave.period;
                HOOK_wave_update_position_iii(e,(char *)e,(ulong)bVar11,(ulong)bVar27);
                uVar23 = uVar15 & 0xfffffffe;
              }
              iVar30 = iVar30 + uVar23;
              puVar1 = &(e->state).apu.channel[2].accumulator;
              *puVar1 = *puVar1 + (bVar12 >> (bVar5 & 0x1f)) * uVar21;
              pCVar20 = (Channel *)(ulong)(uVar28 - uVar21);
            } while (uVar28 - uVar21 != 0);
          }
          if ((iVar29 != 0) && ((e->state).apu.channel[3].status != FALSE)) {
            bVar12 = (e->state).apu.channel[3].envelope.volume;
            bVar5 = (e->state).apu.noise.clock_shift;
            uVar25 = (e->state).apu.noise.ticks;
            uVar24 = (e->state).apu.channel[3].accumulator;
            pCVar20 = in_RSI;
            bVar26 = (e->state).apu.noise.sample;
            do {
              uVar21 = (uint)pCVar20;
              bVar27 = bVar26;
              uVar15 = uVar21;
              if (bVar5 < 0xe) {
                uVar15 = uVar25 >> 1;
                if (uVar21 < uVar15) {
                  uVar25 = uVar25 + uVar21 * -2;
                  uVar15 = uVar21;
                }
                else {
                  uVar7 = (e->state).apu.noise.lfsr;
                  uVar9 = uVar7 >> 1;
                  uVar25 = (e->state).apu.noise.period;
                  bVar31 = (e->state).apu.noise.lfsr_width != LFSR_WIDTH_7;
                  uVar22 = 0x3fff;
                  if (!bVar31) {
                    uVar22 = 0x7fbf;
                  }
                  (e->state).apu.noise.lfsr =
                       (short)(((uVar7 ^ uVar9) & 1) << (bVar31 << 3 | 6U)) + (uVar22 & uVar9);
                  bVar27 = ~(byte)uVar9 & 1;
                  (e->state).apu.noise.sample = bVar27;
                }
                (e->state).apu.noise.ticks = uVar25;
              }
              uVar24 = uVar24 + (-bVar26 & bVar12) * uVar15;
              pCVar20 = (Channel *)(ulong)(uVar21 - uVar15);
              bVar26 = bVar27;
            } while (uVar21 - uVar15 != 0);
            (e->state).apu.channel[3].accumulator = uVar24;
          }
          write_audio_frame(e,total_frames);
          pTVar2 = &(e->state).apu.sync_ticks;
          *pTVar2 = *pTVar2 + (ulong)(total_frames * 2);
          pCVar20 = (Channel *)(ulong)(uVar18 - total_frames);
        }
        local_40 = (int)uVar19;
        uVar14 = uVar14 - local_40;
      }
      if (uVar19 != (e->state).ticks) {
        __assert_fail("APU.sync_ticks == TICKS",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                      ,0xf64,"void apu_synchronize(Emulator *)");
      }
    }
  }
  return;
}

Assistant:

static void apu_synchronize(Emulator* e) {
  if (TICKS > APU.sync_ticks) {
    u32 ticks = TICKS - APU.sync_ticks;
    if (APU.enabled) {
      apu_update(e, ticks);
      assert(APU.sync_ticks == TICKS);
    } else {
      for (; ticks; ticks -= APU_TICKS) {
        write_audio_frame(e, 1);
      }
      APU.sync_ticks = TICKS;
    }
  }
}